

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Editor.cxx
# Opt level: O2

int Fl_Text_Editor::kf_meta_move(int c,Fl_Text_Editor *e)

{
  Fl_Text_Buffer *this;
  int iVar1;
  
  this = (e->super_Fl_Text_Display).mBuffer;
  if ((this->mPrimary).mSelected == false) {
    (e->super_Fl_Text_Display).dragPos = (e->super_Fl_Text_Display).mCursorPos;
  }
  if (c == 0xff52) {
    Fl_Text_Display::insert_position(&e->super_Fl_Text_Display,0);
    iVar1 = 0;
  }
  else {
    if (c != 0xff54) {
      Fl_Text_Buffer::unselect(this);
      Fl::copy((EVP_PKEY_CTX *)0x20b10a,(EVP_PKEY_CTX *)0x0);
      Fl_Text_Display::show_insert_position(&e->super_Fl_Text_Display);
      if (c == 0xff51) {
        iVar1 = 0xff50;
      }
      else {
        if (c != 0xff53) {
          return 1;
        }
        iVar1 = 0xff57;
      }
      kf_move(iVar1,e);
      return 1;
    }
    Fl_Text_Display::insert_position(&e->super_Fl_Text_Display,this->mLength);
    iVar1 = Fl_Text_Display::count_lines
                      (&e->super_Fl_Text_Display,0,((e->super_Fl_Text_Display).mBuffer)->mLength,
                       true);
  }
  Fl_Text_Display::scroll(&e->super_Fl_Text_Display,iVar1,0);
  return 1;
}

Assistant:

int Fl_Text_Editor::kf_meta_move(int c, Fl_Text_Editor* e) {
  if (!e->buffer()->selected())
    e->dragPos = e->insert_position();
  if (c != FL_Up && c != FL_Down) {
    e->buffer()->unselect();
    Fl::copy("", 0, 0);
    e->show_insert_position();
  }
  switch (c) {
    case FL_Up:				// top of buffer
      e->insert_position(0);
      e->scroll(0, 0);
      break;
    case FL_Down:			// end of buffer
      e->insert_position(e->buffer()->length());
      e->scroll(e->count_lines(0, e->buffer()->length(), 1), 0);
      break;
    case FL_Left:			// beginning of line
      kf_move(FL_Home, e);
      break;
    case FL_Right:			// end of line
      kf_move(FL_End, e);
      break;
  }
  return 1;
}